

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMutex_POSIX.c
# Opt level: O0

UINT8 OSMutex_TryLock(OS_MUTEX *mtx)

{
  int iVar1;
  int retVal;
  OS_MUTEX *mtx_local;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)mtx);
  if (iVar1 == 0) {
    mtx_local._7_1_ = '\0';
  }
  else if (iVar1 == 0x10) {
    mtx_local._7_1_ = '\x01';
  }
  else {
    mtx_local._7_1_ = 0xff;
  }
  return mtx_local._7_1_;
}

Assistant:

UINT8 OSMutex_TryLock(OS_MUTEX* mtx)
{
	int retVal;
	
	retVal = pthread_mutex_trylock(&mtx->hMutex);
	if (! retVal)
		return 0x00;
	else if (retVal == EBUSY)
		return 0x01;
	else
		return 0xFF;
}